

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O1

bool slang::ast::builtins::isComparable(Type *type)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = Type::isNumeric(type);
  bVar2 = true;
  if (!bVar1) {
    if (type->canonical == (Type *)0x0) {
      Type::resolveCanonical(type);
    }
    bVar2 = (type->canonical->super_Symbol).kind == StringType;
  }
  return bVar2;
}

Assistant:

static bool isComparable(const Type& type) {
    return type.isNumeric() || type.isString();
}